

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

qpdf_stream_decode_level_e __thiscall
qpdf::Stream::writeStreamJSON
          (Stream *this,int json_version,Writer *jw,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename,bool no_data_key
          )

{
  bool bVar1;
  Members *pMVar2;
  logic_error *plVar3;
  Writer *pWVar4;
  int iVar5;
  Pl_Buffer *pipeline;
  bool bVar6;
  string_view sv;
  bool filtered;
  allocator<char> local_10d;
  qpdf_json_stream_data_e local_10c;
  string local_108;
  int local_e4;
  QPDFObjectHandle dict;
  Pl_Buffer buf_pl;
  Pl_Discard discard;
  string local_50;
  
  local_e4 = json_version;
  pMVar2 = stream(this);
  local_10c = json_data;
  if (json_data < qpdf_sj_file) {
    if (p != (Pipeline *)0x0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,
                 "QPDF_Stream::writeStreamJSON: pipeline should only be supplied when json_data is file"
                );
      goto LAB_001c34ff;
    }
  }
  else if (json_data == qpdf_sj_file) {
    if (p == (Pipeline *)0x0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,
                 "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
LAB_001c34ff:
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (data_filename->_M_string_length == 0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,
                 "QPDF_Stream::writeStreamJSON: data_filename must be supplied when json_data is file"
                );
      goto LAB_001c34ff;
    }
  }
  buf_pl.super_Pipeline._vptr_Pipeline._0_1_ = 0x7b;
  JSON::Writer::writeStart(jw,(char *)&buf_pl);
  if (local_10c == qpdf_sj_none) {
    JSON::Writer::writeNext(jw);
    JSON::Writer::operator<<(jw,"\"dict\": ");
    QPDFObjectHandle::writeJSON(&pMVar2->stream_dict,local_e4,jw,false);
    buf_pl.super_Pipeline._vptr_Pipeline._0_1_ = 0x7d;
    JSON::Writer::writeEnd(jw,(char *)&buf_pl);
    return decode_level;
  }
  Pl_Discard::Pl_Discard(&discard);
  Pl_Buffer::Pl_Buffer(&buf_pl,"stream data",(Pipeline *)0x0);
  pipeline = (Pl_Buffer *)&discard;
  if (!no_data_key) {
    pipeline = &buf_pl;
  }
  if (local_10c != qpdf_sj_inline) {
    pipeline = &buf_pl;
  }
  filtered = false;
  bVar6 = decode_level != qpdf_dl_none;
  iVar5 = 2;
  while( true ) {
    if (iVar5 == 0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar3,"QPDF_Stream: failed to get stream data");
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    bVar1 = pipeStreamData(this,&pipeline->super_Pipeline,&filtered,0,decode_level,false,iVar5 == 2)
    ;
    if ((bVar1) && ((!bVar6 || (filtered != false)))) break;
    Pl_Buffer::getString_abi_cxx11_(&local_50,&buf_pl);
    std::__cxx11::string::~string((string *)&local_50);
    bVar6 = false;
    decode_level = qpdf_dl_none;
    iVar5 = iVar5 + -1;
  }
  QPDFObjectHandle::unsafeShallowCopy(&dict);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/Length",&local_10d);
  QPDFObjectHandle::removeKey(&dict,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if ((bVar6) && (filtered == true)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/Filter",&local_10d);
    QPDFObjectHandle::removeKey(&dict,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"/DecodeParms",&local_10d);
    QPDFObjectHandle::removeKey(&dict,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  if (local_10c == qpdf_sj_file) {
    pWVar4 = JSON::Writer::writeNext(jw);
    pWVar4 = JSON::Writer::operator<<(pWVar4,"\"datafile\": \"");
    JSON::Writer::encode_string(&local_108,data_filename);
    (*pWVar4->p->_vptr_Pipeline[2])
              (pWVar4->p,CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
               ,local_108._M_string_length);
    JSON::Writer::operator<<(pWVar4,"\"");
    std::__cxx11::string::~string((string *)&local_108);
    Pl_Buffer::getString_abi_cxx11_(&local_108,&buf_pl);
    Pipeline::writeString(p,&local_108);
  }
  else {
    if (local_10c != qpdf_sj_inline) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,"QPDF_Stream::writeStreamJSON : unexpected value of json_data");
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (no_data_key) goto LAB_001c33f7;
    pWVar4 = JSON::Writer::writeNext(jw);
    JSON::Writer::operator<<(pWVar4,"\"data\": \"");
    Pl_Buffer::getString_abi_cxx11_(&local_108,&buf_pl);
    sv._M_str._1_7_ = local_108._M_dataplus._M_p._1_7_;
    sv._M_str._0_1_ = local_108._M_dataplus._M_p._0_1_;
    sv._M_len = local_108._M_string_length;
    pWVar4 = JSON::Writer::writeBase64(jw,sv);
    JSON::Writer::operator<<(pWVar4,"\"");
  }
  std::__cxx11::string::~string((string *)&local_108);
LAB_001c33f7:
  pWVar4 = JSON::Writer::writeNext(jw);
  JSON::Writer::operator<<(pWVar4,"\"dict\": ");
  QPDFObjectHandle::writeJSON(&dict,local_e4,jw,false);
  local_108._M_dataplus._M_p._0_1_ = 0x7d;
  JSON::Writer::writeEnd(jw,(char *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Pl_Buffer::~Pl_Buffer(&buf_pl);
  Pl_Discard::~Pl_Discard(&discard);
  return decode_level;
}

Assistant:

qpdf_stream_decode_level_e
Stream::writeStreamJSON(
    int json_version,
    JSON::Writer& jw,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename,
    bool no_data_key)
{
    auto s = stream();
    switch (json_data) {
    case qpdf_sj_none:
    case qpdf_sj_inline:
        if (p != nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline should only be supplied "
                "when json_data is file");
        }
        break;
    case qpdf_sj_file:
        if (p == nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
        }
        if (data_filename.empty()) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: data_filename must be supplied "
                "when json_data is file");
        }
        break;
    }

    jw.writeStart('{');

    if (json_data == qpdf_sj_none) {
        jw.writeNext();
        jw << R"("dict": )";
        s->stream_dict.writeJSON(json_version, jw);
        jw.writeEnd('}');
        return decode_level;
    }

    Pl_Discard discard;
    Pl_Buffer buf_pl{"stream data"};
    Pipeline* data_pipeline = &buf_pl;
    if (no_data_key && json_data == qpdf_sj_inline) {
        data_pipeline = &discard;
    }
    // pipeStreamData produced valid data.
    bool buf_pl_ready = false;
    bool filtered = false;
    bool filter = (decode_level != qpdf_dl_none);
    for (int attempt = 1; attempt <= 2; ++attempt) {
        bool succeeded =
            pipeStreamData(data_pipeline, &filtered, 0, decode_level, false, (attempt == 1));
        if (!succeeded || (filter && !filtered)) {
            // Try again
            filter = false;
            decode_level = qpdf_dl_none;
            buf_pl.getString(); // reset buf_pl
        } else {
            buf_pl_ready = true;
            break;
        }
    }
    if (!buf_pl_ready) {
        throw std::logic_error("QPDF_Stream: failed to get stream data");
    }
    // We can use unsafeShallowCopy because we are only touching top-level keys.
    auto dict = s->stream_dict.unsafeShallowCopy();
    dict.removeKey("/Length");
    if (filter && filtered) {
        dict.removeKey("/Filter");
        dict.removeKey("/DecodeParms");
    }
    if (json_data == qpdf_sj_file) {
        jw.writeNext() << R"("datafile": ")" << JSON::Writer::encode_string(data_filename) << "\"";
        p->writeString(buf_pl.getString());
    } else if (json_data == qpdf_sj_inline) {
        if (!no_data_key) {
            jw.writeNext() << R"("data": ")";
            jw.writeBase64(buf_pl.getString()) << "\"";
        }
    } else {
        throw std::logic_error("QPDF_Stream::writeStreamJSON : unexpected value of json_data");
    }

    jw.writeNext() << R"("dict": )";
    dict.writeJSON(json_version, jw);
    jw.writeEnd('}');

    return decode_level;
}